

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_zip_reader_extract_iter_state *
mz_zip_reader_extract_iter_new(mz_zip_archive *pZip,mz_uint file_index,mz_uint flags)

{
  mz_uint64 mVar1;
  mz_bool mVar2;
  mz_zip_reader_extract_iter_state *pmVar3;
  size_t sVar4;
  ulong uVar5;
  void *pvVar6;
  mz_uint64 mVar7;
  long lVar8;
  ulong uVar9;
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  int local_48 [6];
  ushort local_2e;
  ushort local_2c;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return (mz_zip_reader_extract_iter_state *)0x0;
  }
  if (pZip->m_pState == (mz_zip_internal_state *)0x0) {
    return (mz_zip_reader_extract_iter_state *)0x0;
  }
  pmVar3 = (mz_zip_reader_extract_iter_state *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x2fb0);
  if (pmVar3 == (mz_zip_reader_extract_iter_state *)0x0) {
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return (mz_zip_reader_extract_iter_state *)0x0;
  }
  mVar2 = mz_zip_reader_file_stat(pZip,file_index,&pmVar3->file_stat);
  if (mVar2 != 0) {
    if (((pmVar3->file_stat).m_bit_flag & 0x61) == 0) {
      if (((flags >> 10 & 1) == 0) && (((pmVar3->file_stat).m_method & 0xfff7) != 0)) {
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
      }
      else {
        pmVar3->pZip = pZip;
        pmVar3->flags = flags;
        pmVar3->status = 0;
        pmVar3->file_crc32 = 0;
        pmVar3->read_buf_ofs = 0;
        pmVar3->out_buf_ofs = 0;
        pmVar3->pRead_buf = (void *)0x0;
        pmVar3->pWrite_buf = (void *)0x0;
        pmVar3->out_blk_remain = 0;
        mVar1 = (pmVar3->file_stat).m_local_header_ofs;
        pmVar3->cur_file_ofs = mVar1;
        sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar1,local_48,0x1e);
        if (sVar4 == 0x1e) {
          if (local_48[0] == 0x4034b50) {
            mVar1 = pmVar3->cur_file_ofs;
            uVar5 = (pmVar3->file_stat).m_comp_size;
            mVar7 = (ulong)local_2c + (ulong)local_2e + mVar1 + 0x1e;
            pmVar3->cur_file_ofs = mVar7;
            if (uVar5 + (ulong)local_2c + (ulong)local_2e + mVar1 + 0x1e <= pZip->m_archive_size) {
              pvVar6 = pZip->m_pState->m_pMem;
              if (pvVar6 == (void *)0x0) {
                if (((flags >> 10 & 1) == 0) && ((pmVar3->file_stat).m_method != 0)) {
                  sVar4 = 0x2000;
                  if (uVar5 < 0x2000) {
                    sVar4 = uVar5;
                  }
                  pmVar3->read_buf_size = sVar4;
                  pvVar6 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar4);
                  pmVar3->pRead_buf = pvVar6;
                  if (pvVar6 == (void *)0x0) {
                    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                    goto LAB_00120d96;
                  }
                  uVar5 = (pmVar3->file_stat).m_comp_size;
                }
                else {
                  pmVar3->read_buf_size = 0;
                }
                lVar8 = 0x28;
                uVar9 = 0;
              }
              else {
                pmVar3->pRead_buf = (void *)((long)pvVar6 + mVar7);
                pmVar3->read_buf_avail = uVar5;
                lVar8 = 0x18;
                uVar9 = uVar5;
              }
              *(ulong *)((long)&pmVar3->pZip + lVar8) = uVar9;
              pmVar3->comp_remaining = uVar5;
              if ((flags >> 10 & 1) != 0) {
                return pmVar3;
              }
              if ((pmVar3->file_stat).m_method == 0) {
                return pmVar3;
              }
              (pmVar3->inflator).m_state = 0;
              pvVar6 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x8000);
              pmVar3->pWrite_buf = pvVar6;
              if (pvVar6 != (void *)0x0) {
                return pmVar3;
              }
              pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
              if (pmVar3->pRead_buf != (void *)0x0) {
                (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar3->pRead_buf);
              }
              goto LAB_00120d96;
            }
          }
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
        }
        else {
          pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        }
      }
    }
    else {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    }
  }
LAB_00120d96:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar3);
  return (mz_zip_reader_extract_iter_state *)0x0;
}

Assistant:

mz_zip_reader_extract_iter_state *
mz_zip_reader_extract_iter_new(mz_zip_archive *pZip, mz_uint file_index,
                               mz_uint flags) {
  mz_zip_reader_extract_iter_state *pState;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

  /* Argument sanity check */
  if ((!pZip) || (!pZip->m_pState))
    return NULL;

  /* Allocate an iterator status structure */
  pState = (mz_zip_reader_extract_iter_state *)pZip->m_pAlloc(
      pZip->m_pAlloc_opaque, 1, sizeof(mz_zip_reader_extract_iter_state));
  if (!pState) {
    mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    return NULL;
  }

  /* Fetch file details */
  if (!mz_zip_reader_file_stat(pZip, file_index, &pState->file_stat)) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  /* Encryption and patch files are not supported. */
  if (pState->file_stat.m_bit_flag &
      (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED |
       MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION |
       MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG)) {
    mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  /* This function only supports decompressing stored and deflate. */
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) &&
      (pState->file_stat.m_method != 0) &&
      (pState->file_stat.m_method != MZ_DEFLATED)) {
    mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  /* Init state - save args */
  pState->pZip = pZip;
  pState->flags = flags;

  /* Init state - reset variables to defaults */
  pState->status = TINFL_STATUS_DONE;
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
  pState->file_crc32 = MZ_CRC32_INIT;
#endif
  pState->read_buf_ofs = 0;
  pState->out_buf_ofs = 0;
  pState->pRead_buf = NULL;
  pState->pWrite_buf = NULL;
  pState->out_blk_remain = 0;

  /* Read and parse the local directory entry. */
  pState->cur_file_ofs = pState->file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, pState->cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE) {
    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG) {
    mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  pState->cur_file_ofs +=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((pState->cur_file_ofs + pState->file_stat.m_comp_size) >
      pZip->m_archive_size) {
    mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  /* Decompress the file either directly from memory or from a file input
   * buffer. */
  if (pZip->m_pState->m_pMem) {
    pState->pRead_buf =
        (mz_uint8 *)pZip->m_pState->m_pMem + pState->cur_file_ofs;
    pState->read_buf_size = pState->read_buf_avail =
        pState->file_stat.m_comp_size;
    pState->comp_remaining = pState->file_stat.m_comp_size;
  } else {
    if (!((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ||
          (!pState->file_stat.m_method))) {
      /* Decompression required, therefore intermediate read buffer required */
      pState->read_buf_size = MZ_MIN(pState->file_stat.m_comp_size,
                                     (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
      if (NULL ==
          (pState->pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                              (size_t)pState->read_buf_size))) {
        mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
        return NULL;
      }
    } else {
      /* Decompression not required - we will be reading directly into user
       * buffer, no temp buf required */
      pState->read_buf_size = 0;
    }
    pState->read_buf_avail = 0;
    pState->comp_remaining = pState->file_stat.m_comp_size;
  }

  if (!((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ||
        (!pState->file_stat.m_method))) {
    /* Decompression required, init decompressor */
    tinfl_init(&pState->inflator);

    /* Allocate write buffer */
    if (NULL == (pState->pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                                     TINFL_LZ_DICT_SIZE))) {
      mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
      if (pState->pRead_buf)
        pZip->m_pFree(pZip->m_pAlloc_opaque, pState->pRead_buf);
      pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
      return NULL;
    }
  }

  return pState;
}